

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.h
# Opt level: O1

void __thiscall subprocess::Popen::init_args<subprocess::error>(Popen *this,error *farg)

{
  vector<char_*,_std::allocator<char_*>_> *this_00;
  int iVar1;
  pointer ppcVar2;
  pointer pbVar3;
  runtime_error *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  pointer pbVar4;
  long in_FS_OFFSET;
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (farg->deferred_ == true) {
    iVar1 = (this->stream_).write_to_parent_;
    if (iVar1 == 0) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,"Set output before redirecting error to output");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_003f5197;
    }
    (this->stream_).err_write_ = iVar1;
  }
  if (farg->wr_ch_ != -1) {
    (this->stream_).err_write_ = farg->wr_ch_;
  }
  if (farg->rd_ch_ != -1) {
    (this->stream_).err_read_ = farg->rd_ch_;
  }
  this_00 = &this->cargv_;
  ppcVar2 = (this->cargv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->cargv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppcVar2) {
    (this->cargv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppcVar2;
  }
  std::vector<char_*,_std::allocator<char_*>_>::reserve
            (this_00,((long)(this->vargs_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->vargs_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
  pbVar4 = (this->vargs_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (this->vargs_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 != pbVar3) {
    do {
      local_30 = (pbVar4->_M_dataplus)._M_p;
      std::vector<char*,std::allocator<char*>>::emplace_back<char*>
                ((vector<char*,std::allocator<char*>> *)this_00,&local_30);
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != pbVar3);
  }
  local_30 = (char *)0x0;
  std::vector<char*,std::allocator<char*>>::emplace_back<char*>
            ((vector<char*,std::allocator<char*>> *)this_00,&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_003f5197:
  __stack_chk_fail();
}

Assistant:

inline void Popen::init_args(F&& farg, Args&&... args)
{
  detail::ArgumentDeducer argd(this);
  argd.set_option(std::forward<F>(farg));
  init_args(std::forward<Args>(args)...);
}